

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reciprocal.c
# Opt level: O0

uint64_t randomx_reciprocal(uint32_t divisor)

{
  long lVar1;
  byte bVar2;
  uint32_t shift;
  uint64_t r;
  uint64_t q;
  uint64_t p2exp63;
  uint32_t divisor_local;
  
  lVar1 = 0x3f;
  if (divisor != 0) {
    for (; divisor >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  bVar2 = 0x40 - ((byte)lVar1 ^ 0x3f);
  return (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) / ZEXT416(divisor),0) <<
         (bVar2 & 0x3f)) +
         (ulong)(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) % ZEXT416(divisor),0) <<
                (bVar2 & 0x3f)) / (ulong)divisor;
}

Assistant:

uint64_t randomx_reciprocal(uint32_t divisor) {

	assert(divisor != 0);

	const uint64_t p2exp63 = 1ULL << 63;
	const uint64_t q = p2exp63 / divisor;
	const uint64_t r = p2exp63 % divisor;

#ifdef __GNUC__
	const uint32_t shift = 64 - __builtin_clzll(divisor);
#else
	uint32_t shift = 32;
	for (uint32_t k = 1U << 31; (k & divisor) == 0; k >>= 1)
		--shift;
#endif

	return (q << shift) + ((r << shift) / divisor);
}